

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Carrier.cpp
# Opt level: O1

istream * operator>>(istream *is,Carrier *item)

{
  istream *piVar1;
  istream *piVar2;
  mapped_type *pmVar3;
  string tmpcate;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  key_type local_40;
  
  local_58 = 0;
  local_50[0] = 0;
  local_60 = local_50;
  piVar1 = std::operator>>(is,(string *)item);
  piVar1 = std::operator>>(piVar1,(string *)&local_60);
  piVar2 = (istream *)std::istream::operator>>((istream *)piVar1,&item->gridNum);
  piVar2 = (istream *)std::istream::operator>>(piVar2,item->gridSize);
  piVar2 = (istream *)std::istream::operator>>(piVar2,item->gridSize + 1);
  piVar2 = (istream *)std::istream::operator>>(piVar2,item->gridSize + 2);
  piVar2 = (istream *)std::istream::operator>>(piVar2,item->gridSize + 3);
  std::istream::operator>>(piVar2,&item->atk);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_60,local_60 + local_58);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&carrier_cate_m_abi_cxx11_,&local_40);
  item->category = *pmVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return is;
}

Assistant:

istream &operator>>(istream &is,Carrier &item){
    string tmpcate;
    is>>item.name>>tmpcate>>item.gridNum>>item.gridSize[0]>>item.gridSize[1]>>item.gridSize[2]>>item.gridSize[3]>>item.atk;
    item.category=CARRIER_CATE_convert(tmpcate);
    return is;
}